

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O2

void __thiscall
slang::ast::CaseStatement::visitStmts<no_ansi_port_decl::MainVisitor&>
          (CaseStatement *this,MainVisitor *visitor)

{
  long lVar1;
  ItemGroup *item;
  pointer pIVar2;
  
  pIVar2 = (this->items)._M_ptr;
  for (lVar1 = (this->items)._M_extent._M_extent_value * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    Statement::visit<no_ansi_port_decl::MainVisitor&>((pIVar2->stmt).ptr,visitor);
    pIVar2 = pIVar2 + 1;
  }
  if (this->defaultCase != (Statement *)0x0) {
    Statement::visit<no_ansi_port_decl::MainVisitor&>(this->defaultCase,visitor);
    return;
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto& item : items)
            item.stmt->visit(visitor);
        if (defaultCase)
            defaultCase->visit(visitor);
    }